

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O1

void __thiscall deqp::gls::ShaderRenderCase::~ShaderRenderCase(ShaderRenderCase *this)

{
  ~ShaderRenderCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

ShaderRenderCase::~ShaderRenderCase (void)
{
	ShaderRenderCase::deinit();
}